

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkBottom(Abc_Ntk_t *pNtk,int Level)

{
  int iVar1;
  Abc_Ntk_t *pNtkNew_00;
  char *pcVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pNodeNew;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  char Buffer [500];
  int Level_local;
  Abc_Ntk_t *pNtk_local;
  
  Buffer._492_4_ = Level;
  unique0x100003b8 = pNtk;
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                  ,0x2f7,"Abc_Ntk_t *Abc_NtkBottom(Abc_Ntk_t *, int)");
  }
  iVar1 = Abc_NtkLatchNum(stack0xfffffffffffffff0);
  if (iVar1 == 0) {
    pNtkNew_00 = Abc_NtkAlloc(stack0xfffffffffffffff0->ntkType,stack0xfffffffffffffff0->ntkFunc,1);
    sprintf((char *)&pNtkNew,"%s%s",stack0xfffffffffffffff0->pName,"_bot");
    pcVar2 = Extra_UtilStrsav((char *)&pNtkNew);
    pNtkNew_00->pName = pcVar2;
    Abc_NtkCleanCopy(stack0xfffffffffffffff0);
    for (pNodeNew._4_4_ = 0; iVar1 = Abc_NtkPiNum(stack0xfffffffffffffff0), pNodeNew._4_4_ < iVar1;
        pNodeNew._4_4_ = pNodeNew._4_4_ + 1) {
      pAVar3 = Abc_NtkPi(stack0xfffffffffffffff0,pNodeNew._4_4_);
      Abc_NtkDupObj(pNtkNew_00,pAVar3,1);
    }
    for (pNodeNew._4_4_ = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vObjs),
        pNodeNew._4_4_ < iVar1; pNodeNew._4_4_ = pNodeNew._4_4_ + 1) {
      pAVar3 = Abc_NtkObj(stack0xfffffffffffffff0,pNodeNew._4_4_);
      if ((((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_6).pTemp == (void *)0x0)) &&
          (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) &&
         (iVar1 = Abc_ObjLevel(pAVar3), iVar1 <= (int)Buffer._492_4_)) {
        Abc_NtkDupObj(pNtkNew_00,pAVar3,0);
      }
    }
    for (pNodeNew._4_4_ = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vObjs),
        pNodeNew._4_4_ < iVar1; pNodeNew._4_4_ = pNodeNew._4_4_ + 1) {
      pAVar3 = Abc_NtkObj(stack0xfffffffffffffff0,pNodeNew._4_4_);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        for (pNodeNew._0_4_ = 0; iVar1 = Abc_ObjFaninNum(pAVar3), (int)pNodeNew < iVar1;
            pNodeNew._0_4_ = (int)pNodeNew + 1) {
          pAVar4 = Abc_ObjFanin(pAVar3,(int)pNodeNew);
          if (((pAVar3->field_6).pTemp != (void *)0x0) && ((pAVar4->field_6).pTemp != (void *)0x0))
          {
            Abc_ObjAddFanin((pAVar3->field_6).pCopy,(pAVar4->field_6).pCopy);
          }
        }
      }
    }
    for (pNodeNew._4_4_ = 0; iVar1 = Vec_PtrSize(stack0xfffffffffffffff0->vObjs),
        pNodeNew._4_4_ < iVar1; pNodeNew._4_4_ = pNodeNew._4_4_ + 1) {
      pAVar3 = Abc_NtkObj(stack0xfffffffffffffff0,pNodeNew._4_4_);
      if (pAVar3 != (Abc_Obj_t *)0x0) {
        for (pNodeNew._0_4_ = 0; iVar1 = Abc_ObjFaninNum(pAVar3), (int)pNodeNew < iVar1;
            pNodeNew._0_4_ = (int)pNodeNew + 1) {
          pAVar4 = Abc_ObjFanin(pAVar3,(int)pNodeNew);
          if ((((pAVar3->field_6).pTemp == (void *)0x0) && ((pAVar4->field_6).pTemp != (void *)0x0))
             && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
            pObj_00 = Abc_NtkCreatePo(pNtkNew_00);
            Abc_ObjAddFanin(pObj_00,(pAVar4->field_6).pCopy);
            pcVar2 = Abc_ObjName(pObj_00);
            Abc_ObjAssignName(pObj_00,pcVar2,(char *)0x0);
          }
        }
      }
    }
    iVar1 = Abc_NtkCheck(pNtkNew_00);
    if (iVar1 == 0) {
      fprintf(_stdout,"Abc_NtkBottom(): Network check has failed.\n");
    }
    return pNtkNew_00;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                ,0x2f8,"Abc_Ntk_t *Abc_NtkBottom(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkBottom( Abc_Ntk_t * pNtk, int Level )
{
    char Buffer[500];
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    sprintf( Buffer, "%s%s", pNtk->pName, "_bot" );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );

    // copy the internal nodes
    // duplicate the nets and nodes (CIs/COs/latches already dupped)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL && Abc_ObjIsNode(pObj) && Abc_ObjLevel(pObj) <= Level )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pObj->pCopy && pFanin->pCopy )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // create new primary outputs
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( !pObj->pCopy && pFanin->pCopy && Abc_ObjIsNode(pFanin) )
            {
                Abc_Obj_t * pNodeNew = Abc_NtkCreatePo(pNtkNew);
                Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
                Abc_ObjAssignName( pNodeNew, Abc_ObjName(pNodeNew), NULL );
            }

    // perform the final check
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkBottom(): Network check has failed.\n" );
    return pNtkNew;
}